

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O3

void __thiscall
SuffixTree::GeneralizedSuffixTree::ProcessLCAQueries(GeneralizedSuffixTree *this,Node *node)

{
  uint *puVar1;
  uint uVar2;
  Node *pNVar3;
  pointer ppNVar4;
  _Hash_node_base *p_Var5;
  
  p_Var5 = (node->edges)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      if (*(int *)&p_Var5[4]._M_nxt != 0) {
        ProcessLCAQueries(this,(Node *)p_Var5[2]._M_nxt);
        pNVar3 = DSUUnite(this,node,(Node *)p_Var5[2]._M_nxt);
        pNVar3->lca_class = node;
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
    for (p_Var5 = (node->edges)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
        p_Var5 = p_Var5->_M_nxt) {
      if (*(int *)&p_Var5[4]._M_nxt == 0) {
        uVar2 = *(uint *)&p_Var5[2]._M_nxt[1]._M_nxt;
        ppNVar4 = (this->previous_suffixes).
                  super__Vector_base<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppNVar4[uVar2] != (Node *)0x0) {
          pNVar3 = DSUFind(this,ppNVar4[uVar2]);
          puVar1 = &pNVar3->lca_class->num_lca;
          *puVar1 = *puVar1 + 1;
          ppNVar4 = (this->previous_suffixes).
                    super__Vector_base<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        ppNVar4[uVar2] = node;
      }
    }
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::ProcessLCAQueries (Node *node)
{
    for (const auto &edge_pair : node->edges)
        if (edge_pair.second.length)
        {
            ProcessLCAQueries (edge_pair.second.node);
            Node *leader = DSUUnite (node, edge_pair.second.node);
            leader->lca_class = node;
        }
    for (const auto &edge_pair : node->edges)
        if (!edge_pair.second.length)
        {
            uint string_num = edge_pair.second.leaf->string_number;
            if (previous_suffixes[string_num])
                ++ (DSUFind (previous_suffixes[string_num])->lca_class->num_lca);
            previous_suffixes[string_num] = node;
        }
}